

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::LoopPeeling::CreateBlockBefore(LoopPeeling *this,BasicBlock *bb)

{
  IRContext *pIVar1;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Analysis preserved_analyses;
  DefUseManager *this_00;
  __uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
  this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  size_type sVar7;
  Instruction *pIVar8;
  LoopDescriptor *pLVar9;
  Loop *this_02;
  pointer pBVar10;
  const_reference pvVar11;
  Function *pFVar12;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_120;
  pointer local_118;
  BasicBlock *ret;
  undefined1 local_100 [8];
  iterator it;
  anon_class_16_2_9859ae92 local_d0;
  function<void_(spvtools::opt::Instruction_*)> local_c0;
  undefined1 local_a0 [16];
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_90;
  function<void_(unsigned_int_*)> local_88;
  undefined1 local_68 [16];
  BasicBlock *bb_pred;
  Loop *in_loop;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_38;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_30;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_bb;
  CFG *cfg;
  DefUseManager *def_use_mgr;
  BasicBlock *bb_local;
  LoopPeeling *this_local;
  
  this_00 = IRContext::get_def_use_mgr(this->context_);
  this_01.
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>)
       IRContext::cfg(this->context_);
  new_bb._M_t.
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )this_01.
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  uVar4 = BasicBlock::id(bb);
  pvVar6 = CFG::preds((CFG *)this_01.
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                      ,uVar4);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
  if (sVar7 != 1) {
    __assert_fail("cfg.preds(bb->id()).size() == 1 && \"More than one predecessor\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x15d,"BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
  }
  pIVar8 = (Instruction *)::operator_new(0x70);
  pIVar1 = this->context_;
  uVar4 = IRContext::TakeNextId(this->context_);
  memset(&in_loop,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&in_loop);
  opt::Instruction::Instruction(pIVar8,pIVar1,OpLabel,0,uVar4,(OperandList *)&in_loop);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_38,pIVar8);
  MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)&local_30,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_38);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&in_loop);
  pLVar9 = LoopUtils::GetLoopDescriptor(&this->loop_utils_);
  this_02 = LoopDescriptor::operator[](pLVar9,bb);
  bb_pred = (BasicBlock *)this_02;
  if (this_02 != (Loop *)0x0) {
    pBVar10 = std::
              unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ::get(&local_30);
    Loop::AddBasicBlock(this_02,pBVar10);
    pLVar9 = LoopUtils::GetLoopDescriptor(&this->loop_utils_);
    pBVar10 = std::
              unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ::operator->(&local_30);
    uVar4 = BasicBlock::id(pBVar10);
    LoopDescriptor::SetBasicBlockToLoop(pLVar9,uVar4,(Loop *)bb_pred);
  }
  pIVar1 = this->context_;
  pBVar10 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->(&local_30);
  pIVar8 = BasicBlock::GetLabelInst(pBVar10);
  pBVar10 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            get(&local_30);
  IRContext::set_instr_block(pIVar1,pIVar8,pBVar10);
  pBVar10 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->(&local_30);
  pIVar8 = BasicBlock::GetLabelInst(pBVar10);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,pIVar8);
  uVar2 = new_bb;
  uVar4 = BasicBlock::id(bb);
  pvVar6 = CFG::preds((CFG *)uVar2._M_t.
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                      ,uVar4);
  pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar6,0);
  local_68._8_8_ =
       CFG::block((CFG *)uVar2._M_t.
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
                  *pvVar11);
  BasicBlock::tail((BasicBlock *)local_68);
  pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->
                     ((iterator_template<spvtools::opt::Instruction> *)local_68);
  local_90 = &local_30;
  local_a0._8_8_ = bb;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::LoopPeeling::CreateBlockBefore(spvtools::opt::BasicBlock*)::__0,void>
            ((function<void(unsigned_int*)> *)&local_88,(anon_class_16_2_5bc67618 *)(local_a0 + 8));
  opt::Instruction::ForEachInId(pIVar8,&local_88);
  std::function<void_(unsigned_int_*)>::~function(&local_88);
  uVar2 = new_bb;
  uVar4 = BasicBlock::id((BasicBlock *)local_68._8_8_);
  uVar5 = BasicBlock::id(bb);
  CFG::RemoveEdge((CFG *)uVar2._M_t.
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
                  uVar4,uVar5);
  uVar2 = new_bb;
  uVar4 = BasicBlock::id((BasicBlock *)local_68._8_8_);
  pBVar10 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->(&local_30);
  uVar5 = BasicBlock::id(pBVar10);
  CFG::AddEdge((CFG *)uVar2._M_t.
                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,uVar4,
               uVar5);
  BasicBlock::tail((BasicBlock *)local_a0);
  pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)local_a0);
  analysis::DefUseManager::AnalyzeInstUse(this_00,pIVar8);
  local_d0.new_bb = &local_30;
  local_d0.def_use_mgr = this_00;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopPeeling::CreateBlockBefore(spvtools::opt::BasicBlock*)::__1,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_c0,&local_d0);
  BasicBlock::ForEachPhiInst(bb,&local_c0,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_c0);
  pIVar1 = this->context_;
  pBVar10 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            get(&local_30);
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&it.iterator_,pIVar1,pBVar10,preserved_analyses);
  uVar4 = BasicBlock::id(bb);
  InstructionBuilder::AddBranch((InstructionBuilder *)&it.iterator_,uVar4);
  uVar2 = new_bb;
  pBVar10 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            get(&local_30);
  CFG::RegisterBlock((CFG *)uVar2._M_t.
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
                     pBVar10);
  pFVar12 = LoopUtils::GetFunction(&this->loop_utils_);
  uVar4 = BasicBlock::id(bb);
  _local_100 = opt::Function::FindBlock(pFVar12,uVar4);
  pFVar12 = LoopUtils::GetFunction(&this->loop_utils_);
  _ret = opt::Function::end(pFVar12);
  bVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_100,
                     (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&ret);
  if (!bVar3) {
    __assert_fail("it != loop_utils_.GetFunction()->end() && \"Basic block not found in the function.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x185,"BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
  }
  local_118 = std::
              unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ::get(&local_30);
  pFVar12 = LoopUtils::GetFunction(&this->loop_utils_);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  unique_ptr(&local_120,&local_30);
  opt::Function::AddBasicBlock(pFVar12,&local_120,_local_100);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_120);
  pBVar10 = local_118;
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_30);
  return pBVar10;
}

Assistant:

BasicBlock* LoopPeeling::CreateBlockBefore(BasicBlock* bb) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();
  CFG& cfg = *context_->cfg();
  assert(cfg.preds(bb->id()).size() == 1 && "More than one predecessor");

  // TODO(1841): Handle id overflow.
  std::unique_ptr<BasicBlock> new_bb =
      MakeUnique<BasicBlock>(std::unique_ptr<Instruction>(new Instruction(
          context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})));
  // Update the loop descriptor.
  Loop* in_loop = (*loop_utils_.GetLoopDescriptor())[bb];
  if (in_loop) {
    in_loop->AddBasicBlock(new_bb.get());
    loop_utils_.GetLoopDescriptor()->SetBasicBlockToLoop(new_bb->id(), in_loop);
  }

  context_->set_instr_block(new_bb->GetLabelInst(), new_bb.get());
  def_use_mgr->AnalyzeInstDefUse(new_bb->GetLabelInst());

  BasicBlock* bb_pred = cfg.block(cfg.preds(bb->id())[0]);
  bb_pred->tail()->ForEachInId([bb, &new_bb](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_bb->id();
    }
  });
  cfg.RemoveEdge(bb_pred->id(), bb->id());
  cfg.AddEdge(bb_pred->id(), new_bb->id());
  def_use_mgr->AnalyzeInstUse(&*bb_pred->tail());

  // Update the incoming branch.
  bb->ForEachPhiInst([&new_bb, def_use_mgr](Instruction* phi) {
    phi->SetInOperand(1, {new_bb->id()});
    def_use_mgr->AnalyzeInstUse(phi);
  });
  InstructionBuilder(
      context_, new_bb.get(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
      .AddBranch(bb->id());
  cfg.RegisterBlock(new_bb.get());

  // Add the basic block to the function.
  Function::iterator it = loop_utils_.GetFunction()->FindBlock(bb->id());
  assert(it != loop_utils_.GetFunction()->end() &&
         "Basic block not found in the function.");
  BasicBlock* ret = new_bb.get();
  loop_utils_.GetFunction()->AddBasicBlock(std::move(new_bb), it);
  return ret;
}